

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O0

void mkcavearea(boolean rockit)

{
  boolean waslit_00;
  char *pcVar1;
  xchar local_15;
  xchar local_14;
  xchar local_13;
  xchar local_12;
  xchar local_11;
  boolean waslit;
  int iStack_10;
  xchar i;
  xchar ymax;
  xchar ymin;
  xchar xmax;
  xchar xmin;
  int dist;
  boolean rockit_local;
  
  local_11 = u.ux;
  local_12 = u.ux;
  local_13 = u.uy;
  local_14 = u.uy;
  waslit_00 = rm_waslit();
  if (rockit == '\0') {
    pcVar1 = "extends the";
    if (level->locations[u.ux][u.uy].typ == '\x18') {
      pcVar1 = "creates a";
    }
    pline("A mysterious force %s cave around you!",pcVar1);
  }
  else {
    pline("Crash!  The ceiling collapses around you!");
  }
  (*windowprocs.win_pause)(P_MESSAGE);
  for (iStack_10 = 1; iStack_10 < 3; iStack_10 = iStack_10 + 1) {
    local_12 = local_12 + '\x01';
    if (iStack_10 < 2) {
      local_13 = local_13 + -1;
      local_14 = local_14 + '\x01';
      for (local_15 = local_11; local_15 < local_12; local_15 = local_15 + '\x01') {
        mkcavepos(local_15,local_13,iStack_10,waslit_00,rockit);
        mkcavepos(local_15,local_14,iStack_10,waslit_00,rockit);
      }
    }
    for (local_15 = local_13; local_15 <= local_14; local_15 = local_15 + '\x01') {
      mkcavepos(local_11 + -1,local_15,iStack_10,waslit_00,rockit);
      mkcavepos(local_12,local_15,iStack_10,waslit_00,rockit);
    }
    flush_screen();
    (*windowprocs.win_delay)();
    local_11 = local_11 + -1;
  }
  if ((rockit == '\0') && (level->locations[u.ux][u.uy].typ == '\x18')) {
    level->locations[u.ux][u.uy].typ = '\x19';
    if (waslit_00 != '\0') {
      *(uint *)&level->locations[u.ux][u.uy].field_0x6 =
           *(uint *)&level->locations[u.ux][u.uy].field_0x6 & 0xfffff7ff | 0x800;
    }
    newsym((int)u.ux,(int)u.uy);
  }
  vision_full_recalc = '\x01';
  return;
}

Assistant:

static void mkcavearea(boolean rockit)
{
    int dist;
    xchar xmin = u.ux, xmax = u.ux;
    xchar ymin = u.uy, ymax = u.uy;
    xchar i;
    boolean waslit = rm_waslit();

    if (rockit) pline("Crash!  The ceiling collapses around you!");
    else pline("A mysterious force %s cave around you!",
	     (level->locations[u.ux][u.uy].typ == CORR) ? "creates a" : "extends the");
    win_pause_output(P_MESSAGE);

    for (dist = 1; dist <= 2; dist++) {
	xmin--; xmax++;

	/* top and bottom */
	if (dist < 2) { /* the area is wider that it is high */
	    ymin--; ymax++;
	    for (i = xmin+1; i < xmax; i++) {
		mkcavepos(i, ymin, dist, waslit, rockit);
		mkcavepos(i, ymax, dist, waslit, rockit);
	    }
	}

	/* left and right */
	for (i = ymin; i <= ymax; i++) {
	    mkcavepos(xmin, i, dist, waslit, rockit);
	    mkcavepos(xmax, i, dist, waslit, rockit);
	}

	flush_screen();	/* make sure the new glyphs shows up */
	win_delay_output();
    }

    if (!rockit && level->locations[u.ux][u.uy].typ == CORR) {
	level->locations[u.ux][u.uy].typ = ROOM;
	if (waslit) level->locations[u.ux][u.uy].waslit = TRUE;
	newsym(u.ux, u.uy); /* in case player is invisible */
    }

    vision_full_recalc = 1;	/* everything changed */
}